

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_dataset_shuffle(ggml_opt_context_t opt_ctx,ggml_opt_dataset_t dataset,int64_t idata)

{
  iterator this;
  long in_RDX;
  long in_RSI;
  int64_t ishard_max;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_00000070;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_00000078;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_00000080;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffb8;
  difference_type in_stack_ffffffffffffffc0;
  
  if (*(long *)(in_RSI + 0x20) < in_RDX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
               ,0x83,"GGML_ASSERT(%s) failed","idata <= dataset->ndata");
  }
  if (in_RDX < 0) {
    std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffb8);
    std::vector<long,_std::allocator<long>_>::end(in_stack_ffffffffffffffb8);
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              (in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  else {
    if (in_RDX % *(long *)(in_RSI + 0x28) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x8a,"GGML_ASSERT(%s) failed","idata % dataset->ndata_shard == 0");
    }
    this = std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffb8);
    std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffb8);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator+
              ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
               this._M_current,in_stack_ffffffffffffffc0);
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              (in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  return;
}

Assistant:

void ggml_opt_dataset_shuffle(ggml_opt_context_t opt_ctx, ggml_opt_dataset_t dataset, int64_t idata) {
    GGML_ASSERT(idata <= dataset->ndata);

    if (idata < 0) {
        std::shuffle(dataset->permutation.begin(), dataset->permutation.end(), opt_ctx->rng);
        return;
    }

    GGML_ASSERT(idata % dataset->ndata_shard == 0);
    const int64_t ishard_max = idata / dataset->ndata_shard;
    std::shuffle(dataset->permutation.begin(), dataset->permutation.begin() + ishard_max, opt_ctx->rng);
}